

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O0

void __thiscall ccs::BuildContext::addProperty(BuildContext *this,PropDef *propDef)

{
  int iVar1;
  uint propertyNumber;
  undefined4 extraout_var;
  Origin *origin;
  string *name;
  Property local_130;
  undefined1 local_80 [8];
  Value value;
  PropDef *propDef_local;
  BuildContext *this_local;
  
  value.name_.field_2._8_8_ = propDef;
  Value::Value((Value *)local_80,&propDef->value_);
  Value::setName((Value *)local_80,(string *)(value.name_.field_2._8_8_ + 8));
  iVar1 = (*this->_vptr_BuildContext[2])();
  name = (string *)(value.name_.field_2._8_8_ + 8);
  origin = (Origin *)(value.name_.field_2._8_8_ + 0x90);
  propertyNumber = DagBuilder::nextProperty(this->dag_);
  Property::Property(&local_130,(Value *)local_80,origin,propertyNumber,
                     (bool)(*(byte *)(value.name_.field_2._8_8_ + 0xb8) & 1));
  Node::addProperty((Node *)CONCAT44(extraout_var,iVar1),name,&local_130);
  Property::~Property(&local_130);
  Value::~Value((Value *)local_80);
  return;
}

Assistant:

void BuildContext::addProperty(const ast::PropDef &propDef) {
  Value value(propDef.value_);
  value.setName(propDef.name_);
  node().addProperty(propDef.name_, Property(value,
      propDef.origin_, dag_.nextProperty(), propDef.override_));
}